

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-updating.cpp
# Opt level: O3

TypeMap * __thiscall
wasm::GlobalTypeRewriter::rebuildTypes
          (TypeMap *__return_storage_ptr__,GlobalTypeRewriter *this,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *additionalPrivateTypes)

{
  TypeBuilder *this_00;
  size_t *__args;
  bool *os;
  int *piVar1;
  iterator __position;
  _List_node_base *p_Var2;
  pointer pFVar3;
  pointer pHVar4;
  _Storage<wasm::HeapType,_true> _Var5;
  undefined1 auVar6 [16];
  _List_node_base _Var7;
  pointer pSVar8;
  undefined8 uVar9;
  pointer pvVar10;
  bool open;
  int iVar11;
  Shareability share;
  HeapTypeKind HVar12;
  const_iterator __begin2;
  const_iterator cVar13;
  undefined4 extraout_var;
  iterator iVar14;
  HeapType *__args_00;
  iterator iVar15;
  pointer __dest;
  undefined1 auVar16 [8];
  undefined4 extraout_var_00;
  _Storage<wasm::HeapType,_true> _Var17;
  size_t sVar18;
  iterator iVar19;
  Type TVar20;
  Type TVar21;
  Struct *pSVar22;
  Continuation CVar23;
  HeapType HVar24;
  undefined4 extraout_var_01;
  variant_alternative_t<0UL,_variant<vector<HeapType,_allocator<HeapType>_>,_Error>_> *pvVar25;
  mapped_type *pmVar26;
  fd_set *__writefds;
  _Storage<wasm::HeapType,_true> _Var27;
  byte extraout_DL;
  fd_set *extraout_RDX;
  fd_set *__readfds;
  fd_set *extraout_RDX_00;
  __buckets_ptr *__args_01;
  ulong extraout_RDX_01;
  undefined1 auVar28 [8];
  _Storage<wasm::HeapType,_true> _Var29;
  size_type __n;
  _List_node_base *p_Var30;
  size_t *psVar31;
  timeval *__timeout;
  long lVar32;
  _Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
  *this_01;
  pointer pFVar33;
  fd_set *pfVar34;
  iterator __end1;
  _Hash_node_base *p_Var35;
  long lVar36;
  _Storage<wasm::HeapType,_true> _Var37;
  uint uVar38;
  long lVar39;
  ulong i;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_unsigned_int>,_false,_true>,_bool>
  pVar40;
  pair<std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_bool> pVar41;
  optional<wasm::HeapType> oVar42;
  Signature SVar43;
  optional<wasm::HeapType> desc;
  optional<wasm::HeapType> desc_00;
  optional<wasm::HeapType> super_00;
  optional<wasm::HeapType> super_01;
  undefined1 local_350 [8];
  unordered_set<wasm::HeapType,_std::hash<wasm::HeapType>,_std::equal_to<wasm::HeapType>,_std::allocator<wasm::HeapType>_>
  additionalSet;
  InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> typeInfo;
  optional<wasm::HeapType> super;
  undefined1 local_2b0 [16];
  pointer local_2a0;
  long local_298;
  void *local_290;
  undefined8 uStack_288;
  long local_280;
  undefined1 *local_278;
  GlobalTypeRewriter *local_270;
  vector<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
  local_268 [12];
  undefined1 auStack_138 [8];
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  privateSupertypes;
  undefined1 auStack_118 [8];
  BuildResult buildResults;
  _List_node_base _Stack_e8;
  _Storage<wasm::HeapType,_true> local_d8;
  long local_d0;
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *local_c8;
  _Storage<wasm::HeapType,_true> local_c0;
  _Storage<wasm::HeapType,_true> local_b8;
  _Storage<wasm::HeapType,_true> _Stack_b0;
  _Storage<wasm::HeapType,_true> local_a8;
  _List_node_base *local_98;
  iterator __end1_1;
  TypeMap *oldToNewTypes;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> elements;
  value_type local_68;
  undefined1 auStack_58 [8];
  Graph indexGraph;
  
  __end1_1._M_node = (_List_node_base *)__return_storage_ptr__;
  wasm::ModuleUtils::collectHeapTypeInfo
            ((InsertOrderedMap<wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo> *)
             &additionalSet._M_h._M_single_bucket,this->wasm,UsedIRTypes,FindVisibility);
  psVar31 = &typeInfo.List.
             super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
             ._M_impl._M_node._M_size;
  __timeout = (timeval *)auStack_118;
  std::
  _Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _Hashtable<__gnu_cxx::__normal_iterator<wasm::HeapType_const*,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>>>
            ((_Hashtable<wasm::HeapType,wasm::HeapType,std::allocator<wasm::HeapType>,std::__detail::_Identity,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_350,
             (additionalPrivateTypes->
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (additionalPrivateTypes->
             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish,0,psVar31,__timeout,&oldToNewTypes);
  auStack_138 = (undefined1  [8])0x0;
  privateSupertypes.
  super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  privateSupertypes.
  super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ::reserve((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
             *)auStack_138,(size_type)typeInfo.Map._M_h._M_before_begin._M_nxt);
  if (typeInfo.Map._M_h._M_single_bucket != (__node_base_ptr)&typeInfo.Map._M_h._M_single_bucket) {
    __args = &typeInfo.List.
              super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
              ._M_impl._M_node._M_size;
    p_Var35 = typeInfo.Map._M_h._M_single_bucket;
    do {
      if ((*(int *)((long)&p_Var35[3]._M_nxt + 4) == 2) ||
         (cVar13 = std::
                   _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                           *)local_350,(key_type *)(p_Var35 + 2)),
         cVar13.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0)) {
        auStack_118 = (undefined1  [8])0x0;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _0_8_ = 0x10;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_index
             = '\0';
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._25_7_ =
             0;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _8_8_ = 0;
        buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _16_8_ = 0;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)0x0;
        typeInfo.List.
        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
        ._M_impl._M_node._M_size = (size_t)p_Var35[2]._M_nxt;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged = true;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)local_2b0,
                   (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                   (buildResults.
                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .
                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    .super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                    ._M_u._M_first._M_storage._M_storage + 8));
        std::
        vector<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>,std::allocator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>>
        ::emplace_back<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>
                  ((vector<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>,std::allocator<std::pair<wasm::HeapType,wasm::SmallVector<wasm::HeapType,1ul>>>>
                    *)auStack_138,
                   (pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)__args);
        if ((pointer)local_2b0._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_2b0._0_8_,(long)local_2a0 - local_2b0._0_8_);
        }
        if (buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._8_8_ != 0) {
          operator_delete((void *)buildResults.
                                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  ._M_u._8_8_,
                          buildResults.
                          super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          .
                          super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          .
                          super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          .
                          super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          ._24_8_ - buildResults.
                                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    ._M_u._8_8_);
        }
        iVar11 = (*this->_vptr_GlobalTypeRewriter[7])();
        auVar6 = (undefined1  [16])stack0xfffffffffffffd38;
        typeInfo.List.
        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
        ._M_impl._M_node._M_size._4_4_ = extraout_var;
        typeInfo.List.
        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
        ._M_impl._M_node._M_size._0_4_ = iVar11;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id._1_7_ = auVar6._9_7_;
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._0_1_ = extraout_DL;
        if (((extraout_DL & 1) != 0) &&
           ((((iVar14 = std::
                        _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                *)&additionalSet._M_h._M_single_bucket,(key_type *)__args),
              iVar14.
              super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_true>
              ._M_cur != (__node_type *)0x0 &&
              ((__node_base_ptr *)
               *(undefined1 **)
                ((long)iVar14.
                       super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_true>
                       ._M_cur + 0x10) != &typeInfo.Map._M_h._M_single_bucket)) &&
             (*(int *)(*(undefined1 **)
                        ((long)iVar14.
                               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_true>
                               ._M_cur + 0x10) + 0x1c) == 2)) ||
            (cVar13 = std::
                      _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                      ::find((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                              *)local_350,(key_type *)__args),
            cVar13.super__Node_iterator_base<wasm::HeapType,_true>._M_cur != (__node_type *)0x0))))
        {
          SmallVector<wasm::HeapType,_1UL>::push_back
                    (&privateSupertypes.
                      super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[-1].second,(HeapType *)__args);
        }
      }
      p_Var35 = p_Var35->_M_nxt;
    } while (p_Var35 != (_Hash_node_base *)&typeInfo.Map._M_h._M_single_bucket);
  }
  auVar16 = auStack_138;
  if ((this->wasm->typeIndices)._M_h._M_element_count == 0) {
    TopologicalSort::
    sortOfImpl<__gnu_cxx::__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_(&)(const_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_&),_wasm::TopologicalSort::sort>
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               &typeInfo.List.
                super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                ._M_impl._M_node._M_size,
               (__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>
                )auStack_138,
               (__normal_iterator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_*,_std::vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>_>
                )privateSupertypes.
                 super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start);
    privateSupertypes.
    super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                  super__Optional_payload_base<wasm::HeapType>._8_8_;
    _Var29 = (_Storage<wasm::HeapType,_true>)
             typeInfo.List.
             super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
             ._M_impl._M_node._M_size;
    _Var37 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType>._M_payload;
  }
  else {
    auStack_118 = (undefined1  [8])&_Stack_e8;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._0_8_ =
         1;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._8_8_ =
         0;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u._16_8_
         = 0;
    buildResults.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_4_ =
         0x3f800000;
    _Stack_e8._M_next = (_List_node_base *)0x0;
    oldToNewTypes = (TypeMap *)0x0;
    elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_c8 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)privateSupertypes.
                  super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (auStack_138 ==
        (undefined1  [8])
        privateSupertypes.
        super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      __n = 0;
    }
    else {
      auVar28 = auStack_138;
      do {
        super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload._0_4_ =
             (int)((ulong)((long)elements.
                                 super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)oldToNewTypes) >>
                  3);
        typeInfo.List.
        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
        ._M_impl._M_node._M_size =
             (((pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_> *)auVar28)->first).id;
        pVar40 = std::
                 _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                 ::_M_emplace<std::pair<wasm::HeapType_const,unsigned_int>>
                           ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,unsigned_int>,std::allocator<std::pair<wasm::HeapType_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                             *)auStack_118,
                            &typeInfo.List.
                             super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                             ._M_impl._M_node._M_size);
        if (((undefined1  [16])pVar40 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          __assert_fail("inserted.second && \"unexpected repeat element\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/topological_sort.h"
                        ,0x3e,
                        "decltype(auto) wasm::TopologicalSort::sortOfImpl(It, It, Args...) [It = __gnu_cxx::__normal_iterator<std::pair<wasm::HeapType, wasm::SmallVector<wasm::HeapType, 1>> *, std::vector<std::pair<wasm::HeapType, wasm::SmallVector<wasm::HeapType, 1>>>>, SortT = std::vector<unsigned int> (&)(const std::vector<std::vector<unsigned int>> &, (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)), Sort = wasm::TopologicalSort::minSort, Args = <(lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>]"
                       );
        }
        __args_00 = (HeapType *)
                    ((long)pVar40.first.
                           super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                           ._M_cur.
                           super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                    + 8);
        if (elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_start ==
            elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>::
          _M_realloc_insert<wasm::HeapType_const&>
                    ((vector<wasm::HeapType,std::allocator<wasm::HeapType>> *)&oldToNewTypes,
                     (iterator)
                     elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start,__args_00);
        }
        else {
          (elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
           super__Vector_impl_data._M_start)->id = __args_00->id;
          elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start =
               elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        auVar28 = (undefined1  [8])((long)auVar28 + 0x30);
      } while (auVar28 != (undefined1  [8])local_c8);
      __n = (long)elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                  _M_impl.super__Vector_impl_data._M_start - (long)oldToNewTypes >> 3;
    }
    auStack_58 = (undefined1  [8])0x0;
    indexGraph.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    indexGraph.
    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::reserve((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)auStack_58,__n);
    for (; auVar16 != (undefined1  [8])local_c8;
        auVar16 = (undefined1  [8])
                  &((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                     *)auVar16)->_M_single_bucket) {
      if (indexGraph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          indexGraph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::_M_realloc_insert<>
                  ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)auStack_58,
                   (iterator)
                   indexGraph.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
      }
      else {
        ((indexGraph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        ((indexGraph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        ((indexGraph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start)->
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        indexGraph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start =
             indexGraph.
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
      }
      lVar39 = ((long)*(pointer *)
                       &((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)auVar16)->_M_rehash_policy -
                (long)(((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                       &((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                          *)auVar16)->_M_element_count)->
                      super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
                      super__Vector_impl_data._M_start >> 3) +
               ((SmallVector<wasm::HeapType,_1UL> *)
               &((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)auVar16)->_M_bucket_count)->usedFixed;
      if (lVar39 != 0) {
        local_98 = (_List_node_base *)
                   &((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)auVar16)->_M_before_begin;
        lVar32 = -8;
        lVar36 = 0;
        do {
          pvVar10 = indexGraph.
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          p_Var30 = (_List_node_base *)
                    ((long)&((((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                              &((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                                 *)auVar16)->_M_element_count)->
                             super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                             _M_impl.super__Vector_impl_data._M_start)->id + lVar32);
          if (lVar36 == 0) {
            p_Var30 = local_98;
          }
          iVar15 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)auStack_118,(key_type *)p_Var30);
          if (iVar15.super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>.
              _M_cur == (__node_type *)0x0) {
            std::__throw_out_of_range("_Map_base::at");
          }
          __position._M_current =
               pvVar10[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              pvVar10[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)(pvVar10 + -1),
                       __position,
                       (uint *)((long)iVar15.
                                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                      ._M_cur + 0x10));
          }
          else {
            *__position._M_current =
                 *(uint *)((long)iVar15.
                                 super__Node_iterator_base<std::pair<const_wasm::HeapType,_unsigned_int>,_true>
                                 ._M_cur + 0x10);
            pvVar10[-1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
          lVar36 = lVar36 + 1;
          lVar32 = lVar32 + 8;
        } while (lVar39 != lVar36);
      }
    }
    local_b8 = (_Storage<wasm::HeapType,_true>)0x0;
    _Stack_b0 = (_Storage<wasm::HeapType,_true>)0x0;
    local_a8 = (_Storage<wasm::HeapType,_true>)0x0;
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::reserve
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_b8._M_value,
               (long)elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                     _M_impl.super__Vector_impl_data._M_start - (long)oldToNewTypes >> 3);
    typeInfo.List.
    super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
    ._M_impl._M_node._M_size = (size_t)auStack_58;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&super,
               ((long)indexGraph.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3) *
               -0x5555555555555555,(allocator_type *)&local_68);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2b0 + 8),
               ((long)indexGraph.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3) *
               -0x5555555555555555,(allocator_type *)&local_68);
    local_290 = (void *)0x0;
    uStack_288 = 0;
    local_280 = 0;
    local_278 = auStack_138;
    local_268[0].
    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268[0].
    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268[0].
    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_270 = this;
    if ((long)indexGraph.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 != 0) {
      lVar39 = (long)indexGraph.
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3;
      this_01 = (_Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                 *)(lVar39 * -0x5555555555555555);
      auVar16 = auStack_58;
      do {
        p_Var2 = ((_List_node_base *)auVar16)->_M_prev;
        for (p_Var30 = (_List_node_base *)
                       (((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &((_List_node_base *)auVar16)->_M_next)->_M_impl).super__Vector_impl_data.
                       _M_start; p_Var30 != p_Var2;
            p_Var30 = (_List_node_base *)((long)&((_Hashtable *)&p_Var30->_M_next)->_M_buckets + 4))
        {
          psVar31 = (size_t *)(ulong)*(uint *)&((_Hashtable *)&p_Var30->_M_next)->_M_buckets;
          piVar1 = (int *)((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::HeapType>._M_payload +
                          (long)psVar31 * 4);
          *piVar1 = *piVar1 + 1;
        }
        auVar16 = (undefined1  [8])&((_List_node_base *)((long)auVar16 + 0x10))->_M_prev;
      } while (auVar16 !=
               (undefined1  [8])
               indexGraph.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
      if ((_Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
           *)0xaaaaaaaaaaaaaaa < this_01) {
        std::__throw_length_error("vector::reserve");
      }
      __dest = std::
               _Vector_base<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
               ::_M_allocate(this_01,(size_t)p_Var30);
      pSVar8 = local_268[0].
               super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)local_268[0].
                    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_268[0].
                    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        memmove(__dest,local_268[0].
                       super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                (long)local_268[0].
                      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_268[0].
                      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_start);
      }
      if (pSVar8 != (pointer)0x0) {
        operator_delete(pSVar8,(long)local_268[0].
                                     super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pSVar8);
      }
      local_268[0].
      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)(&__dest->start + lVar39);
      local_68._0_8_ = (GlobalTypeRewriter *)0x0;
      local_68.index = 0;
      local_268[0].
      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_start = __dest;
      local_268[0].
      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
      ._M_impl.super__Vector_impl_data._M_finish = __dest;
      std::
      vector<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
      ::push_back(local_268,&local_68);
      pSVar8 = local_268[0].
               super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __writefds = (fd_set *)
                   indexGraph.
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
      __readfds = extraout_RDX;
      if ((undefined1  [8])
          indexGraph.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != auStack_58) {
        pfVar34 = (fd_set *)0x0;
        auVar16 = auStack_58;
        do {
          if (*(int *)((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                             super__Optional_payload_base<wasm::HeapType>._M_payload +
                      (long)pfVar34 * 4) == 0) {
            TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
            ::pushChoice((TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>
                          *)&typeInfo.List.
                             super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                             ._M_impl._M_node._M_size,(Index)pfVar34);
            pSVar8[-1].count = pSVar8[-1].count + 1;
            auVar16 = auStack_58;
            __writefds = (fd_set *)
                         indexGraph.
                         super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start;
          }
          pfVar34 = (fd_set *)(ulong)((Index)pfVar34 + 1);
          __readfds = (fd_set *)(((long)__writefds - (long)auVar16 >> 3) * -0x5555555555555555);
        } while (pfVar34 <= __readfds && (long)__readfds - (long)pfVar34 != 0);
        if ((fd_set *)
            (((long)local_268[0].
                    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_268[0].
                    super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
            __readfds) {
          do {
            iVar11 = TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
                     ::Selector::select(local_268[0].
                                        super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + -1,
                                        (int)&typeInfo.List.
                                              super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                                              ._M_impl._M_node._M_size,__readfds,__writefds,
                                        (fd_set *)psVar31,__timeout);
            local_68._0_8_ = CONCAT44(extraout_var_00,iVar11);
            local_68.index = 0;
            std::
            vector<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>::Selector>_>
            ::push_back(local_268,&local_68);
            __writefds = (fd_set *)
                         (((long)indexGraph.
                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start - (long)auStack_58 >> 3)
                         * -0x5555555555555555);
            __readfds = extraout_RDX_00;
          } while ((fd_set *)
                   (((long)local_268[0].
                           super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_268[0].
                           super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) <
                   __writefds);
        }
      }
      TopologicalOrdersImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:82:34)>
      ::Selector::select(local_268[0].
                         super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1,
                         (int)&typeInfo.List.
                               super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                               ._M_impl._M_node._M_size,__readfds,__writefds,(fd_set *)psVar31,
                         __timeout);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&_Stack_e8._M_prev,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_2b0 + 8));
    if (local_268[0].
        super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_268[0].
                      super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_268[0].
                            super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_268[0].
                            super__Vector_base<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector,_std::allocator<wasm::TopologicalOrdersImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_ir_type_updating_cpp:82:34)>::Selector>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_290 != (void *)0x0) {
      operator_delete(local_290,local_280 - (long)local_290);
    }
    if ((pointer)local_2b0._8_8_ != (pointer)0x0) {
      operator_delete((void *)local_2b0._8_8_,local_298 - local_2b0._8_8_);
    }
    if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload !=
        (_Storage<wasm::HeapType,_true>)0x0) {
      operator_delete((void *)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                              super__Optional_payload_base<wasm::HeapType>._M_payload,
                      local_2b0._0_8_ -
                      (long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._M_payload);
    }
    if ((_Storage<wasm::HeapType,_true>)_Stack_e8._M_prev != local_d8) {
      _Var29 = (_Storage<wasm::HeapType,_true>)_Stack_e8._M_prev;
      do {
        __args_01 = &(oldToNewTypes->_M_h)._M_buckets + *(uint *)_Var29;
        if (_Stack_b0 == local_a8) {
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::
          _M_realloc_insert<wasm::HeapType>
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&local_b8._M_value,
                     (iterator)_Stack_b0._M_value.id,(HeapType *)__args_01);
        }
        else {
          *(__buckets_ptr *)_Stack_b0 = *__args_01;
          _Stack_b0 = (_Storage<wasm::HeapType,_true>)((long)_Stack_b0 + 8);
        }
        _Var29 = (_Storage<wasm::HeapType,_true>)((long)_Var29 + 4);
      } while (_Var29 != local_d8);
    }
    if ((_Storage<wasm::HeapType,_true>)_Stack_e8._M_prev != (_Storage<wasm::HeapType,_true>)0x0) {
      operator_delete(_Stack_e8._M_prev,local_d0 - (long)_Stack_e8._M_prev);
    }
    _Var37 = _Stack_b0;
    _Var29 = local_b8;
    privateSupertypes.
    super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_a8;
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)auStack_58);
    if (oldToNewTypes != (TypeMap *)0x0) {
      operator_delete(oldToNewTypes,
                      (long)elements.
                            super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)oldToNewTypes);
    }
    std::
    _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)auStack_118);
  }
  _Var17 = (_Storage<wasm::HeapType,_true>)((long)_Var37 - 8);
  _Var5 = _Var29;
  if ((ulong)_Var29 < (ulong)_Var17 && _Var29 != _Var37) {
    do {
      _Var27 = (_Storage<wasm::HeapType,_true>)((long)_Var5 + 8);
      p_Var30 = *(_List_node_base **)_Var5;
      *(_List_node_base **)_Var5 = *(_List_node_base **)_Var17;
      *(_List_node_base **)_Var17 = p_Var30;
      _Var17 = (_Storage<wasm::HeapType,_true>)((long)_Var17 - 8);
      _Var5 = _Var27;
    } while ((ulong)_Var27 < (ulong)_Var17);
  }
  local_c0 = _Var29;
  if (_Var29 != _Var37) {
    iVar11 = 0;
    do {
      super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
      super__Optional_payload_base<wasm::HeapType>._M_payload._0_4_ = 0;
      typeInfo.List.
      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
      ._M_impl._M_node._M_size = *(ulong *)_Var29;
      pVar41 = InsertOrderedMap<wasm::HeapType,_unsigned_int>::insert
                         (&this->typeIndices,
                          (pair<const_wasm::HeapType,_unsigned_int> *)
                          &typeInfo.List.
                           super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                           ._M_impl._M_node._M_size);
      *(int *)&pVar41.first._M_node._M_node[1]._M_prev = iVar11;
      iVar11 = iVar11 + 1;
      _Var29 = (_Storage<wasm::HeapType,_true>)((long)_Var29 + 8);
    } while (_Var29 != _Var37);
  }
  sVar18 = (this->typeIndices).Map._M_h._M_element_count;
  if (sVar18 == 0) {
    __end1_1._M_node[2]._M_next = (_List_node_base *)0x0;
    (__end1_1._M_node)->_M_next = __end1_1._M_node + 3;
    (__end1_1._M_node)->_M_prev = (_List_node_base *)0x1;
    __end1_1._M_node[1]._M_next = (_List_node_base *)0x0;
    __end1_1._M_node[1]._M_prev = (_List_node_base *)0x0;
    *(undefined4 *)&__end1_1._M_node[2]._M_next = 0x3f800000;
    __end1_1._M_node[2]._M_prev = (_List_node_base *)0x0;
    __end1_1._M_node[3]._M_next = (_List_node_base *)0x0;
  }
  else {
    this_00 = &this->typeBuilder;
    TypeBuilder::grow(this_00,sVar18);
    sVar18 = TypeBuilder::size(this_00);
    TypeBuilder::createRecGroup(this_00,0,sVar18);
    local_98 = (_List_node_base *)&(this->typeIndices).List;
    p_Var30 = (this->typeIndices).List.
              super__List_base<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
              ._M_impl._M_node.super__List_node_base._M_next;
    if (p_Var30 != local_98) {
      local_c8 = (_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->typeIndices;
      uVar38 = 0;
      do {
        _Stack_e8._M_prev = *(_List_node_base **)(p_Var30 + 1);
        _Stack_b0 = (_Storage<wasm::HeapType,_true>)p_Var30[1]._M_prev;
        local_b8 = (_Storage<wasm::HeapType,_true>)_Stack_e8._M_prev;
        local_68._0_8_ = this;
        if (_Stack_e8._M_prev < 0x7d) {
          __assert_fail("!type.isBasic()",
                        "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                        ,0x2df,
                        "void wasm::TypeBuilder::copyHeapType(size_t, HeapType, F) [F = (lambda at /workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)]"
                       );
        }
        oVar42 = HeapType::getDeclaredSuperType((HeapType *)&_Stack_e8._M_prev);
        uVar9 = local_68._0_8_;
        i = (ulong)uVar38;
        if (((undefined1  [16])
             oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          typeInfo.List.
          super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
          ._M_impl._M_node._M_size =
               (size_t)oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
          iVar19 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(local_68._0_8_ + 0x18),
                          (key_type *)
                          &typeInfo.List.
                           super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                           ._M_impl._M_node._M_size);
          if ((iVar19.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
               ._M_cur == (__node_type *)0x0) ||
             ((InsertOrderedMap<wasm::HeapType,_unsigned_int> *)
              *(undefined1 **)
               ((long)iVar19.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                      ._M_cur + 0x10) ==
              (InsertOrderedMap<wasm::HeapType,_unsigned_int> *)(uVar9 + 0x50))) {
            _Var29 = (_Storage<wasm::HeapType,_true>)
                     typeInfo.List.
                     super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                     ._M_impl._M_node._M_size;
          }
          else {
            _Var29._M_value =
                 TypeBuilder::getTempHeapType
                           ((TypeBuilder *)(uVar9 + 0x10),
                            (ulong)*(uint *)(*(undefined1 **)
                                              ((long)iVar19.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                                                  ._M_cur + 0x10) + 0x18));
          }
          oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var29;
          TypeBuilder::setSubType(this_00,i,oVar42);
        }
        oVar42 = HeapType::getDescriptorType((HeapType *)&_Stack_e8._M_prev);
        uVar9 = local_68._0_8_;
        if (((undefined1  [16])
             oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          typeInfo.List.
          super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
          ._M_impl._M_node._M_size =
               (size_t)oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
          iVar19 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(local_68._0_8_ + 0x18),
                          (key_type *)
                          &typeInfo.List.
                           super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                           ._M_impl._M_node._M_size);
          if ((iVar19.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
               ._M_cur == (__node_type *)0x0) ||
             ((InsertOrderedMap<wasm::HeapType,_unsigned_int> *)
              *(undefined1 **)
               ((long)iVar19.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                      ._M_cur + 0x10) ==
              (InsertOrderedMap<wasm::HeapType,_unsigned_int> *)(uVar9 + 0x50))) {
            _Var29 = (_Storage<wasm::HeapType,_true>)
                     typeInfo.List.
                     super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                     ._M_impl._M_node._M_size;
          }
          else {
            _Var29._M_value =
                 TypeBuilder::getTempHeapType
                           ((TypeBuilder *)(uVar9 + 0x10),
                            (ulong)*(uint *)(*(undefined1 **)
                                              ((long)iVar19.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                                                  ._M_cur + 0x10) + 0x18));
          }
          desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          desc.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var29;
          TypeBuilder::setDescriptor(this_00,i,desc);
        }
        oVar42 = HeapType::getDescribedType((HeapType *)&_Stack_e8._M_prev);
        uVar9 = local_68._0_8_;
        if (((undefined1  [16])
             oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
             super__Optional_payload_base<wasm::HeapType> & (undefined1  [16])0x1) !=
            (undefined1  [16])0x0) {
          typeInfo.List.
          super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
          ._M_impl._M_node._M_size =
               (size_t)oVar42.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::HeapType>._M_payload;
          iVar19 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(local_68._0_8_ + 0x18),
                          (key_type *)
                          &typeInfo.List.
                           super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                           ._M_impl._M_node._M_size);
          if ((iVar19.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
               ._M_cur == (__node_type *)0x0) ||
             ((InsertOrderedMap<wasm::HeapType,_unsigned_int> *)
              *(undefined1 **)
               ((long)iVar19.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                      ._M_cur + 0x10) ==
              (InsertOrderedMap<wasm::HeapType,_unsigned_int> *)(uVar9 + 0x50))) {
            _Var29 = (_Storage<wasm::HeapType,_true>)
                     typeInfo.List.
                     super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                     ._M_impl._M_node._M_size;
          }
          else {
            _Var29._M_value =
                 TypeBuilder::getTempHeapType
                           ((TypeBuilder *)(uVar9 + 0x10),
                            (ulong)*(uint *)(*(undefined1 **)
                                              ((long)iVar19.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                                                  ._M_cur + 0x10) + 0x18));
          }
          desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          desc_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var29;
          TypeBuilder::setDescribed(this_00,i,desc_00);
        }
        open = HeapType::isOpen((HeapType *)&_Stack_e8._M_prev);
        TypeBuilder::setOpen(this_00,i,open);
        share = HeapType::getShared((HeapType *)&_Stack_e8._M_prev);
        TypeBuilder::setShared(this_00,i,share);
        elements.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)&local_68;
        auStack_58 = (undefined1  [8])&oldToNewTypes;
        oldToNewTypes = (TypeMap *)this_00;
        indexGraph.
        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)this_00;
        HVar12 = HeapType::getKind((HeapType *)&_Stack_e8._M_prev);
        switch(HVar12) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                             ,0x31b);
        case Func:
          SVar43 = HeapType::getSignature((HeapType *)&_Stack_e8._M_prev);
          TVar20 = TypeBuilder::
                   copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                   ::anon_class_16_2_ecc023e0::operator()
                             ((anon_class_16_2_ecc023e0 *)auStack_58,SVar43.params.id);
          TVar21 = TypeBuilder::
                   copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                   ::anon_class_16_2_ecc023e0::operator()
                             ((anon_class_16_2_ecc023e0 *)auStack_58,SVar43.results.id);
          SVar43.results.id = TVar21.id;
          SVar43.params.id = TVar20.id;
          TypeBuilder::setHeapType(this_00,i,SVar43);
          break;
        case Struct:
          pSVar22 = HeapType::getStruct((HeapType *)&_Stack_e8._M_prev);
          stack0xfffffffffffffd38 = (_List_node_base)ZEXT816(0);
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_engaged = false;
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._9_7_ = 0;
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::reserve
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                     &typeInfo.List.
                      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                      ._M_impl._M_node._M_size,
                     (long)(pSVar22->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pSVar22->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_start >> 4);
          pFVar3 = (pSVar22->fields).super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          for (pFVar33 = (pSVar22->fields).
                         super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                         super__Vector_impl_data._M_start; pFVar33 != pFVar3; pFVar33 = pFVar33 + 1)
          {
            auStack_118 = (undefined1  [8])(pFVar33->type).id;
            buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._0_4_ = pFVar33->packedType;
            buildResults.
            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .
            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
            .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u
            ._4_4_ = pFVar33->mutable_;
            auStack_118 = (undefined1  [8])
                          TypeBuilder::
                          copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                          ::anon_class_16_2_ecc023e0::operator()
                                    ((anon_class_16_2_ecc023e0 *)auStack_58,(Type)auStack_118);
            if (super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._M_payload ==
                (_Storage<wasm::HeapType,_true>)
                super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::HeapType>._8_8_) {
              std::vector<wasm::Field,std::allocator<wasm::Field>>::
              _M_realloc_insert<wasm::Field_const&>
                        ((vector<wasm::Field,std::allocator<wasm::Field>> *)
                         &typeInfo.List.
                          super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                          ._M_impl._M_node._M_size,
                         (iterator)
                         super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                         super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id,
                         (Field *)auStack_118);
            }
            else {
              *(undefined1 (*) [8])
               super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
               super__Optional_payload_base<wasm::HeapType>._M_payload = auStack_118;
              *(undefined8 *)
               ((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                      super__Optional_payload_base<wasm::HeapType>._M_payload + 8) =
                   buildResults.
                   super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .
                   super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                   .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
                   super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                   ._M_u._0_8_;
              super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
              super__Optional_payload_base<wasm::HeapType>._M_payload =
                   (_Storage<wasm::HeapType,_true>)
                   ((long)super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::HeapType>._M_payload + 0x10);
            }
          }
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)auStack_118,
                     (vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                     &typeInfo.List.
                      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                      ._M_impl._M_node._M_size);
          TypeBuilder::setHeapType(this_00,i,(Struct *)auStack_118);
          if (auStack_118 != (undefined1  [8])0x0) {
            operator_delete((void *)auStack_118,
                            buildResults.
                            super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            .
                            super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            ._M_u._8_8_ - (long)auStack_118);
          }
          if (typeInfo.List.
              super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
              ._M_impl._M_node._M_size != 0) {
            operator_delete((void *)typeInfo.List.
                                    super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                                    ._M_impl._M_node._M_size,
                            super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._8_8_ -
                            typeInfo.List.
                            super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                            ._M_impl._M_node._M_size);
          }
          break;
        case Array:
          HeapType::getArray((HeapType *)
                             &typeInfo.List.
                              super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                              ._M_impl._M_node._M_size);
          _Var29 = super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                   super__Optional_payload_base<wasm::HeapType>._M_payload;
          typeInfo.List.
          super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
          ._M_impl._M_node._M_size =
               (size_t)TypeBuilder::
                       copyHeapType<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp:126:14)>
                       ::anon_class_16_2_ecc023e0::operator()
                                 ((anon_class_16_2_ecc023e0 *)auStack_58,
                                  (Type)typeInfo.List.
                                        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                                        ._M_impl._M_node._M_size);
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload = _Var29;
          TypeBuilder::setHeapType
                    (this_00,i,
                     (Array *)&typeInfo.List.
                               super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                               ._M_impl._M_node._M_size);
          break;
        case Cont:
          CVar23 = HeapType::getContinuation((HeapType *)&_Stack_e8._M_prev);
          uVar9 = local_68._0_8_;
          typeInfo.List.
          super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
          ._M_impl._M_node._M_size = (size_t)CVar23.type.id;
          iVar19 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                           *)(local_68._0_8_ + 0x18),
                          (key_type *)
                          &typeInfo.List.
                           super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                           ._M_impl._M_node._M_size);
          if ((iVar19.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
               ._M_cur == (__node_type *)0x0) ||
             ((InsertOrderedMap<wasm::HeapType,_unsigned_int> *)
              *(undefined1 **)
               ((long)iVar19.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                      ._M_cur + 0x10) ==
              (InsertOrderedMap<wasm::HeapType,_unsigned_int> *)(uVar9 + 0x50))) {
            HVar24.id = typeInfo.List.
                        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                        ._M_impl._M_node._M_size;
          }
          else {
            HVar24 = TypeBuilder::getTempHeapType
                               ((TypeBuilder *)(uVar9 + 0x10),
                                (ulong)*(uint *)(*(undefined1 **)
                                                  ((long)iVar19.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                                                  ._M_cur + 0x10) + 0x18));
          }
          TypeBuilder::setHeapType(this_00,i,(Continuation)HVar24.id);
        }
        HVar12 = HeapType::getKind(&local_b8._M_value);
        switch(HVar12) {
        case Basic:
          handle_unreachable("unexpected kind",
                             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/type-updating.cpp"
                             ,0xa0);
        case Func:
          auStack_118 = (undefined1  [8])TypeBuilder::getTempHeapType(this_00,i);
          join_0x00000010_0x00000000_ =
               (_List_node_base)HeapType::getSignature((HeapType *)auStack_118);
          (*this->_vptr_GlobalTypeRewriter[5])
                    (this,local_b8,
                     &typeInfo.List.
                      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                      ._M_impl._M_node._M_size);
          TypeBuilder::setHeapType(this_00,i,(Signature)stack0xfffffffffffffd38);
          break;
        case Struct:
          auStack_118 = (undefined1  [8])TypeBuilder::getTempHeapType(this_00,i);
          pSVar22 = HeapType::getStruct((HeapType *)auStack_118);
          std::vector<wasm::Field,_std::allocator<wasm::Field>_>::vector
                    ((vector<wasm::Field,_std::allocator<wasm::Field>_> *)
                     &typeInfo.List.
                      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                      ._M_impl._M_node._M_size,&pSVar22->fields);
          psVar31 = &typeInfo.List.
                     super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                     ._M_impl._M_node._M_size;
          (*this->_vptr_GlobalTypeRewriter[2])(this,local_b8,psVar31);
          TypeBuilder::setHeapType(this_00,i,(Struct *)psVar31);
          if (typeInfo.List.
              super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
              ._M_impl._M_node._M_size != 0) {
            operator_delete((void *)typeInfo.List.
                                    super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                                    ._M_impl._M_node._M_size,
                            super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
                            super__Optional_payload_base<wasm::HeapType>._8_8_ -
                            typeInfo.List.
                            super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                            ._M_impl._M_node._M_size);
          }
          break;
        case Array:
          HVar24 = TypeBuilder::getTempHeapType(this_00,i);
          typeInfo.List.
          super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
          ._M_impl._M_node._M_size = (size_t)HVar24;
          HeapType::getArray((HeapType *)auStack_118);
          (*this->_vptr_GlobalTypeRewriter[3])(this,local_b8,(HeapType *)auStack_118);
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload =
               (_Storage<wasm::HeapType,_true>)
               buildResults.
               super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
               .
               super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
               .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
               _M_u._0_8_;
          typeInfo.List.
          super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
          ._M_impl._M_node._M_size = (size_t)auStack_118;
          TypeBuilder::setHeapType
                    (this_00,i,
                     (Array *)&typeInfo.List.
                               super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                               ._M_impl._M_node._M_size);
          break;
        case Cont:
          auStack_118 = (undefined1  [8])TypeBuilder::getTempHeapType(this_00,i);
          CVar23 = HeapType::getContinuation((HeapType *)auStack_118);
          typeInfo.List.
          super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
          ._M_impl._M_node._M_size = (size_t)CVar23.type.id;
          (*this->_vptr_GlobalTypeRewriter[4])
                    (this,local_b8,
                     &typeInfo.List.
                      super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                      ._M_impl._M_node._M_size);
          TypeBuilder::setHeapType
                    (this_00,i,
                     (Continuation)
                     typeInfo.List.
                     super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                     ._M_impl._M_node._M_size);
        }
        iVar11 = (*this->_vptr_GlobalTypeRewriter[7])(this,local_b8);
        _Var7 = stack0xfffffffffffffd38;
        typeInfo.List.
        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
        ._M_impl._M_node._M_size._4_4_ = extraout_var_01;
        typeInfo.List.
        super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
        ._M_impl._M_node._M_size._0_4_ = iVar11;
        if ((extraout_RDX_01 & 1) == 0) {
          super_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 0;
          super_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload =
               (_Storage<wasm::HeapType,_true>)extraout_RDX_01;
          unique0x10002c72 = _Var7;
          TypeBuilder::setSubType(this_00,i,super_00);
        }
        else {
          super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload =
               (_Storage<wasm::HeapType,_true>)_Var7._M_prev;
          iVar19 = std::
                   _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   ::find(local_c8,(key_type *)
                                   &typeInfo.List.
                                    super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                                    ._M_impl._M_node._M_size);
          if ((iVar19.
               super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
               ._M_cur == (__node_type *)0x0) ||
             (*(_List_node_base **)
               ((long)iVar19.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                      ._M_cur + 0x10) == local_98)) {
            _Var29 = (_Storage<wasm::HeapType,_true>)
                     typeInfo.List.
                     super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                     ._M_impl._M_node._M_size;
          }
          else {
            _Var29._M_value =
                 TypeBuilder::getTempHeapType
                           (this_00,(ulong)*(uint *)&(*(_List_node_base **)
                                                       ((long)iVar19.
                                                  super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>,_true>
                                                  ._M_cur + 0x10))[1]._M_prev);
          }
          super_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._8_8_ = 1;
          super_01.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
          super__Optional_payload_base<wasm::HeapType>._M_payload._M_value.id =
               (HeapType)(HeapType)_Var29;
          TypeBuilder::setSubType(this_00,i,super_01);
        }
        (*this->_vptr_GlobalTypeRewriter[6])(this,this_00,i,local_b8);
        uVar38 = uVar38 + 1;
        p_Var30 = p_Var30->_M_next;
      } while (p_Var30 != local_98);
    }
    TypeBuilder::build((BuildResult *)auStack_118,this_00);
    if (buildResults.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
        _M_first._M_storage._M_storage[0x10] == '\x01') {
      Fatal::Fatal((Fatal *)&typeInfo.List.
                             super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                             ._M_impl._M_node._M_size);
      os = &super.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
            super__Optional_payload_base<wasm::HeapType>._M_engaged;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,"Internal GlobalTypeRewriter build error: ",0x29);
      wasm::operator<<((ostream *)os,
                       buildResults.
                       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       .
                       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                       ._M_u._0_4_);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)os," at index ",10);
      Fatal::operator<<((Fatal *)&typeInfo.List.
                                  super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                                  ._M_impl._M_node._M_size,(unsigned_long *)auStack_118);
      Fatal::~Fatal((Fatal *)&typeInfo.List.
                              super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                              ._M_impl._M_node._M_size);
    }
    pvVar25 = std::
              get<0ul,std::vector<wasm::HeapType,std::allocator<wasm::HeapType>>,wasm::TypeBuilder::Error>
                        ((variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                          *)auStack_118);
    (__end1_1._M_node)->_M_next = __end1_1._M_node + 3;
    (__end1_1._M_node)->_M_prev = (_List_node_base *)0x1;
    __end1_1._M_node[1]._M_next = (_List_node_base *)0x0;
    __end1_1._M_node[1]._M_prev = (_List_node_base *)0x0;
    *(undefined4 *)&__end1_1._M_node[2]._M_next = 0x3f800000;
    __end1_1._M_node[2]._M_prev = (_List_node_base *)0x0;
    __end1_1._M_node[3]._M_next = (_List_node_base *)0x0;
    p_Var30 = (((_List_base<std::pair<const_wasm::HeapType,_unsigned_int>,_std::allocator<std::pair<const_wasm::HeapType,_unsigned_int>_>_>
                 *)&local_98->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var30 != local_98) {
      do {
        p_Var2 = p_Var30[1]._M_prev;
        unique0x100010a9 = p_Var30[1];
        pHVar4 = (pvVar25->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        pmVar26 = std::__detail::
                  _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::HeapType>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::HeapType>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)__end1_1._M_node,
                               (key_type *)
                               &typeInfo.List.
                                super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                                ._M_impl._M_node._M_size);
        pmVar26->id = pHVar4[(ulong)p_Var2 & 0xffffffff].id;
        p_Var30 = p_Var30->_M_next;
      } while (p_Var30 != local_98);
    }
    mapTypeNamesAndIndices(this,(TypeMap *)__end1_1._M_node);
    (*std::__detail::__variant::
      __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>_&>
      ::_S_vtable._M_arr
      [buildResults.
       super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .
       super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
       .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
       super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._M_u.
       _16_8_ & 0xff]._M_data)
              ((anon_class_1_0_00000001 *)
               &typeInfo.List.
                super__List_base<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>
                ._M_impl._M_node._M_size,
               (variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                *)auStack_118);
  }
  if (local_c0 != (_Storage<wasm::HeapType,_true>)0x0) {
    operator_delete((void *)local_c0,
                    (long)privateSupertypes.
                          super__Vector_base<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)local_c0);
  }
  std::
  vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
  ::~vector((vector<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>,_std::allocator<std::pair<wasm::HeapType,_wasm::SmallVector<wasm::HeapType,_1UL>_>_>_>
             *)auStack_138);
  std::
  _Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_wasm::HeapType,_std::allocator<wasm::HeapType>,_std::__detail::_Identity,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)local_350);
  while (typeInfo.Map._M_h._M_single_bucket != (__node_base_ptr)&typeInfo.Map._M_h._M_single_bucket)
  {
    p_Var35 = (typeInfo.Map._M_h._M_single_bucket)->_M_nxt;
    operator_delete(typeInfo.Map._M_h._M_single_bucket,0x20);
    typeInfo.Map._M_h._M_single_bucket = p_Var35;
  }
  std::
  _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::_List_iterator<std::pair<const_wasm::HeapType,_wasm::ModuleUtils::HeapTypeInfo>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)&additionalSet._M_h._M_single_bucket);
  return (TypeMap *)__end1_1._M_node;
}

Assistant:

GlobalTypeRewriter::TypeMap GlobalTypeRewriter::rebuildTypes(
  const std::vector<HeapType>& additionalPrivateTypes) {
  // Find the heap types that are not publicly observable. Even in a closed
  // world scenario, don't modify public types because we assume that they may
  // be reflected on or used for linking. Figure out where each private type
  // will be located in the builder.
  auto typeInfo = ModuleUtils::collectHeapTypeInfo(
    wasm,
    ModuleUtils::TypeInclusion::UsedIRTypes,
    ModuleUtils::VisibilityHandling::FindVisibility);

  std::unordered_set<HeapType> additionalSet(additionalPrivateTypes.begin(),
                                             additionalPrivateTypes.end());

  std::vector<std::pair<HeapType, SmallVector<HeapType, 1>>> privateSupertypes;
  privateSupertypes.reserve(typeInfo.size());
  for (auto& [type, info] : typeInfo) {
    if (info.visibility != ModuleUtils::Visibility::Private &&
        !additionalSet.count(type)) {
      continue;
    }
    privateSupertypes.push_back({type, {}});

    if (auto super = getDeclaredSuperType(type)) {
      auto it = typeInfo.find(*super);
      // Record the supertype only if it is among the private types.
      if ((it != typeInfo.end() &&
           it->second.visibility == ModuleUtils::Visibility::Private) ||
          additionalSet.count(*super)) {
        privateSupertypes.back().second.push_back(*super);
      }
    }
  }

  // Topological sort to have subtypes first. This is the opposite of the
  // order we need, so the comparison is the opposite of what we ultimately
  // want.
  std::vector<HeapType> sorted;
  if (wasm.typeIndices.empty()) {
    sorted = TopologicalSort::sortOf(privateSupertypes.begin(),
                                     privateSupertypes.end());
  } else {
    sorted =
      TopologicalSort::minSortOf(privateSupertypes.begin(),
                                 privateSupertypes.end(),
                                 [&](Index a, Index b) {
                                   auto typeA = privateSupertypes[a].first;
                                   auto typeB = privateSupertypes[b].first;
                                   // Preserve type order.
                                   auto itA = wasm.typeIndices.find(typeA);
                                   auto itB = wasm.typeIndices.find(typeB);
                                   bool hasA = itA != wasm.typeIndices.end();
                                   bool hasB = itB != wasm.typeIndices.end();
                                   if (hasA != hasB) {
                                     // Types with preserved indices must be
                                     // sorted before (after in this reversed
                                     // comparison) types without indices to
                                     // maintain transitivity.
                                     return !hasA;
                                   }
                                   if (hasA && *itA != *itB) {
                                     return !(itA->second < itB->second);
                                   }
                                   // Break ties by the arbitrary order we
                                   // have collected the types in.
                                   return a > b;
                                 });
  }
  std::reverse(sorted.begin(), sorted.end());
  Index i = 0;
  for (auto type : sorted) {
    typeIndices[type] = i++;
  }

  if (typeIndices.size() == 0) {
    return {};
  }

  typeBuilder.grow(typeIndices.size());

  // All the input types are distinct, so we need to make sure the output types
  // are distinct as well. Further, the new types may have more recursions than
  // the original types, so the old recursion groups may not be sufficient any
  // more. Both of these problems are solved by putting all the new types into a
  // single large recursion group.
  typeBuilder.createRecGroup(0, typeBuilder.size());

  // Create the temporary heap types.
  i = 0;
  auto map = [&](HeapType type) -> HeapType {
    if (auto it = typeIndices.find(type); it != typeIndices.end()) {
      return typeBuilder[it->second];
    }
    return type;
  };
  for (auto [type, _] : typeIndices) {
    typeBuilder[i].copy(type, map);
    switch (type.getKind()) {
      case HeapTypeKind::Func: {
        auto newSig = HeapType(typeBuilder[i]).getSignature();
        modifySignature(type, newSig);
        typeBuilder[i] = newSig;
        break;
      }
      case HeapTypeKind::Struct: {
        auto newStruct = HeapType(typeBuilder[i]).getStruct();
        modifyStruct(type, newStruct);
        typeBuilder[i] = newStruct;
        break;
      }
      case HeapTypeKind::Array: {
        auto newArray = HeapType(typeBuilder[i]).getArray();
        modifyArray(type, newArray);
        typeBuilder[i] = newArray;
        break;
      }
      case HeapTypeKind::Cont: {
        auto newCont = HeapType(typeBuilder[i]).getContinuation();
        modifyContinuation(type, newCont);
        typeBuilder[i] = newCont;
        break;
      }
      case HeapTypeKind::Basic:
        WASM_UNREACHABLE("unexpected kind");
    }

    if (auto super = getDeclaredSuperType(type)) {
      typeBuilder[i].subTypeOf(map(*super));
    } else {
      typeBuilder[i].subTypeOf(std::nullopt);
    }

    modifyTypeBuilderEntry(typeBuilder, i, type);
    ++i;
  }

  auto buildResults = typeBuilder.build();
#ifndef NDEBUG
  if (auto* err = buildResults.getError()) {
    Fatal() << "Internal GlobalTypeRewriter build error: " << err->reason
            << " at index " << err->index;
  }
#endif
  auto& newTypes = *buildResults;

  // TODO: It is possible that the newly built rec group matches some public rec
  // group. If that is the case, we need to try a different permutation of the
  // types or add a brand type to distinguish the private types.

  // Map the old types to the new ones.
  TypeMap oldToNewTypes;
  for (auto [type, index] : typeIndices) {
    oldToNewTypes[type] = newTypes[index];
  }
  mapTypeNamesAndIndices(oldToNewTypes);
  return oldToNewTypes;
}